

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void BamTools::Internal::BamStandardIndex::CheckBufferSize
               (uchar **buffer,uint *bufferLength,uint *requestedBytes)

{
  void *pvVar1;
  uint *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  stringstream s;
  bad_alloc *anon_var_0;
  
  if (*in_RSI < *in_RDX) {
    *in_RSI = *in_RDX + 10;
    if ((void *)*in_RDI != (void *)0x0) {
      operator_delete__((void *)*in_RDI);
    }
    pvVar1 = operator_new__((ulong)*in_RSI);
    *in_RDI = pvVar1;
  }
  return;
}

Assistant:

void BamStandardIndex::CheckBufferSize(unsigned char*& buffer, unsigned int& bufferLength,
                                       const unsigned int& requestedBytes)
{
    try {
        if (requestedBytes > bufferLength) {
            bufferLength = requestedBytes + 10;
            delete[] buffer;
            buffer = new unsigned char[bufferLength];
        }
    } catch (std::bad_alloc&) {
        std::stringstream s;
        s << "out of memory when allocating " << requestedBytes << " bytes";
        throw BamException("BamStandardIndex::CheckBufferSize", s.str());
    }
}